

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-batched.cpp
# Opt level: O0

gpt2_batch * gpt2_batch_init(int32_t n_tokens,int32_t embd)

{
  float *pfVar1;
  id *piVar2;
  gpt2_pos *pgVar3;
  gpt2_seq_id *pgVar4;
  int8_t *piVar5;
  int in_EDX;
  int in_ESI;
  gpt2_batch *in_RDI;
  
  gpt2_batch::gpt2_batch(in_RDI);
  if (in_EDX == 0) {
    piVar2 = (id *)malloc((long)in_ESI << 2);
    in_RDI->token = piVar2;
  }
  else {
    pfVar1 = (float *)malloc((long)in_ESI * 4 * (long)in_EDX);
    in_RDI->embd = pfVar1;
  }
  pgVar3 = (gpt2_pos *)malloc((long)in_ESI << 2);
  in_RDI->pos = pgVar3;
  pgVar4 = (gpt2_seq_id *)malloc((long)in_ESI << 2);
  in_RDI->seq_id = pgVar4;
  piVar5 = (int8_t *)malloc((long)in_ESI);
  in_RDI->logits = piVar5;
  return in_RDI;
}

Assistant:

struct gpt2_batch gpt2_batch_init(int32_t n_tokens, int32_t embd) {
    gpt2_batch batch;

    if (embd) {
        batch.embd = (float *) malloc(sizeof(float) * n_tokens * embd);
    } else {
        batch.token = (gpt_vocab::id *) malloc(sizeof(gpt_vocab::id) * n_tokens);
    }

    batch.pos    = (gpt2_pos *)    malloc(sizeof(gpt2_pos)    * n_tokens);
    batch.seq_id = (gpt2_seq_id *) malloc(sizeof(gpt2_seq_id) * n_tokens);
    batch.logits = (int8_t *)      malloc(sizeof(int8_t)      * n_tokens);

    return batch;
}